

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_copy_function_info.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateCopyFunctionInfo::Copy(CreateCopyFunctionInfo *this)

{
  type other;
  CreateInfo *in_RSI;
  _func_int **local_20;
  
  make_uniq<duckdb::CreateCopyFunctionInfo,duckdb::CopyFunction_const&>
            ((duckdb *)&local_20,(CopyFunction *)&in_RSI[1].catalog.field_2);
  other = unique_ptr<duckdb::CreateCopyFunctionInfo,_std::default_delete<duckdb::CreateCopyFunctionInfo>,_true>
          ::operator*((unique_ptr<duckdb::CreateCopyFunctionInfo,_std::default_delete<duckdb::CreateCopyFunctionInfo>,_true>
                       *)&local_20);
  CreateInfo::CopyProperties(in_RSI,&other->super_CreateInfo);
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo = local_20;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateCopyFunctionInfo::Copy() const {
	auto result = make_uniq<CreateCopyFunctionInfo>(function);
	CopyProperties(*result);
	return std::move(result);
}